

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderInvarianceTests::init(ShaderInvarianceTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  undefined8 name;
  Precision PVar2;
  TestNode *this_00;
  BasicInvarianceTest *pBVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  char **value;
  char **value_00;
  char **value_01;
  char **value_02;
  char **value_03;
  char *__s;
  Precision precision;
  char *__s_00;
  char *__s_01;
  bool bVar7;
  undefined1 local_500 [32];
  _Base_ptr local_4e0;
  size_t local_4d8;
  allocator<char> local_4cf;
  allocator<char> local_4ce;
  allocator<char> local_4cd;
  allocator<char> local_4cc;
  allocator<char> local_4cb;
  allocator<char> local_4ca;
  allocator<char> local_4c9;
  undefined1 local_4c8 [48];
  Precision local_498;
  Precision local_494;
  BasicInvarianceTest *local_490;
  FormatArgumentList args;
  undefined1 local_440 [40];
  undefined1 local_418 [40];
  undefined1 local_3f0 [40];
  undefined1 local_3c8 [40];
  undefined1 local_3a0 [40];
  undefined1 local_378 [40];
  undefined1 local_350 [40];
  undefined1 local_328 [40];
  undefined1 local_300 [40];
  undefined1 local_2d8 [40];
  undefined1 local_2b0 [40];
  undefined1 local_288 [40];
  undefined1 local_260 [40];
  undefined1 local_238 [40];
  string local_210;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0;
  string local_190;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pcVar6 = init::precisions[lVar4].name;
    local_498 = init::precisions[lVar4].prec;
    this_00 = (TestNode *)operator_new(0x70);
    pcVar5 = "Invariance tests using the given precision.";
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_00,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,pcVar6,
               "Invariance tests using the given precision.");
    local_500._8_4_ = _S_red;
    local_500._16_8_ = (_Base_ptr)0x0;
    local_500._24_8_ = local_500 + 8;
    local_4d8 = 0;
    local_4e0 = (_Base_ptr)local_500._24_8_;
    std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_4c9);
    local_4c8._0_8_ = "VERSION";
    std::__cxx11::string::string((string *)(local_4c8 + 8),local_50);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_4c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"attribute",&local_4ca);
    local_328._0_8_ = "IN";
    std::__cxx11::string::string((string *)(local_328 + 8),(string *)&local_1b0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_328);
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"varying",&local_4cb);
    local_350._0_8_ = "OUT";
    std::__cxx11::string::string((string *)(local_350 + 8),local_1d0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_350);
    std::__cxx11::string::string<std::allocator<char>>(local_1f0,pcVar6,&local_4cc);
    local_378._0_8_ = "IN_PREC";
    std::__cxx11::string::string((string *)(local_378 + 8),local_1f0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_378);
    de::toString<char_const*>(&local_210,(de *)&init::precisions[lVar4].highValue,value);
    local_3a0._0_8_ = "HIGH_VALUE";
    std::__cxx11::string::string((string *)(local_3a0 + 8),(string *)&local_210);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_3a0);
    de::toString<char_const*>(&local_190,(de *)&init::precisions[lVar4].invHighValue,value_00);
    local_3c8._0_8_ = "HIGH_VALUE_INV";
    std::__cxx11::string::string((string *)(local_3c8 + 8),(string *)&local_190);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_3c8);
    de::toString<char_const*>(&local_70,(de *)&init::precisions[lVar4].mediumValue,value_01);
    local_3f0._0_8_ = "MEDIUM_VALUE";
    std::__cxx11::string::string((string *)(local_3f0 + 8),(string *)&local_70);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_3f0);
    de::toString<char_const*>(&local_90,(de *)&init::precisions[lVar4].lowValue,value_02);
    local_418._0_8_ = "LOW_VALUE";
    std::__cxx11::string::string((string *)(local_418 + 8),(string *)&local_90);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_418);
    de::toString<char_const*>(&local_b0,(de *)&init::precisions[lVar4].invlowValue,value_03);
    local_440._0_8_ = "LOW_VALUE_INV";
    std::__cxx11::string::string((string *)(local_440 + 8),(string *)&local_b0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_440);
    de::toString<int>(&local_d0,&init::precisions[lVar4].loopIterations);
    local_2d8._0_8_ = "LOOP_ITERS";
    std::__cxx11::string::string((string *)(local_2d8 + 8),(string *)&local_d0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_2d8);
    de::toString<int>(&local_f0,&init::precisions[lVar4].loopPartialIterations);
    local_238._0_8_ = "LOOP_ITERS_PARTIAL";
    std::__cxx11::string::string((string *)(local_238 + 8),(string *)&local_f0);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_238);
    de::toString<int>(&local_110,&init::precisions[lVar4].loopNormalizationExponent);
    local_300._0_8_ = "LOOP_NORM_FRACT_EXP";
    std::__cxx11::string::string((string *)(local_300 + 8),(string *)&local_110);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_300);
    std::__cxx11::string::string<std::allocator<char>>
              (local_130,init::precisions[lVar4].loopNormalizationConstantLiteral,&local_4cd);
    local_260._0_8_ = "LOOP_NORM_LITERAL";
    std::__cxx11::string::string((string *)(local_260 + 8),local_130);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_260);
    std::__cxx11::string::string<std::allocator<char>>
              (local_150,init::precisions[lVar4].loopMultiplier,&local_4ce);
    local_288._0_8_ = "LOOP_MULTIPLIER";
    std::__cxx11::string::string((string *)(local_288 + 8),local_150);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_288);
    std::__cxx11::string::string<std::allocator<char>>
              (local_170,init::precisions[lVar4].sumLoopNormalizationConstantLiteral,&local_4cf);
    local_2b0._0_8_ = "SUM_LOOP_NORM_LITERAL";
    std::__cxx11::string::string((string *)(local_2b0 + 8),local_170);
    anon_unknown_1::FormatArgumentList::operator<<
              ((FormatArgumentList *)local_500,(FormatArgument *)local_2b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&args,(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_500);
    std::__cxx11::string::~string((string *)(local_2b0 + 8));
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string((string *)(local_288 + 8));
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string((string *)(local_260 + 8));
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string((string *)(local_300 + 8));
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)(local_238 + 8));
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)(local_2d8 + 8));
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)(local_440 + 8));
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)(local_418 + 8));
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)(local_3f0 + 8));
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)(local_3c8 + 8));
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)(local_3a0 + 8));
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)(local_378 + 8));
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::~string((string *)(local_350 + 8));
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string((string *)(local_328 + 8));
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)(local_4c8 + 8));
    std::__cxx11::string::~string(local_50);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_500);
    tcu::TestNode::addChild((TestNode *)this,this_00);
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_500,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\tv_unrelated = a_input.xzxz + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * (1.08 * a_input.zyzy * a_input.xzxz) * ${HIGH_VALUE_INV} * (a_input.z * a_input.zzxz - a_input.z * a_input.zzxz) + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) / ${HIGH_VALUE};\n\tgl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar5);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_4c8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tgl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar5);
    pcVar6 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"common_subexpression_0",
               "Shader shares a subexpression with an unrelated variable.",(string *)local_500,
               (string *)local_4c8);
    tcu::TestNode::addChild(this_00,(TestNode *)pBVar3);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string((string *)local_500);
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_500,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 a = ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy - ${HIGH_VALUE} * a_input.zzxx;\n\t${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n\t${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n\t${IN_PREC} vec4 d = (${LOW_VALUE} * a_input.yzxx) * (${LOW_VALUE} * a_input.yzzw) * (1.1*${LOW_VALUE_INV} * a_input.yzxx) * (${LOW_VALUE_INV} * a_input.xzzy);\n\t${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n\tv_unrelated = a + b + c + d + e;\n\tgl_Position = a_input + fract(c) + e;\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_4c8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n\t${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n\t${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tgl_Position = a_input + fract(c) + e;\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    pcVar6 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"common_subexpression_1",
               "Shader shares a subexpression with an unrelated variable.",(string *)local_500,
               (string *)local_4c8);
    tcu::TestNode::addChild(this_00,(TestNode *)pBVar3);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string((string *)local_500);
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_500,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n\t${IN_PREC} vec4 b = (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) * (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n\t${IN_PREC} vec4 c = a * a;\n\t${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n\tv_unrelated = a + b + c + d;\n\tgl_Position = a_input + d;\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_4c8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n\t${IN_PREC} vec4 c = a * a;\n\t${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tgl_Position = a_input + d;\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    pcVar6 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"common_subexpression_2",
               "Shader shares a subexpression with an unrelated variable.",(string *)local_500,
               (string *)local_4c8);
    tcu::TestNode::addChild(this_00,(TestNode *)pBVar3);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string((string *)local_500);
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_500,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} float x = a_input.x * 0.2;\n\t${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n\t${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n\t${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n\t${IN_PREC} vec4 f = x*a + x*b + x*c;\n\tv_unrelated = f;\n\t${IN_PREC} vec4 g = x * (a + b + c);\n\tgl_Position = a_input + g;\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_4c8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} float x = a_input.x * 0.2;\n\t${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n\t${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n\t${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 g = x * (a + b + c);\n\tgl_Position = a_input + g;\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    pcVar6 = "Shader shares a subexpression with an unrelated variable.";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"common_subexpression_3",
               "Shader shares a subexpression with an unrelated variable.",(string *)local_500,
               (string *)local_4c8);
    tcu::TestNode::addChild(this_00,(TestNode *)pBVar3);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string((string *)local_500);
    precision = PRECISION_LOWP;
    while (precision != PRECISION_LAST) {
      pcVar5 = glu::getPrecisionName(precision);
      PVar2 = local_498;
      if ((int)precision < (int)local_498) {
        PVar2 = precision;
      }
      bVar7 = PVar2 == PRECISION_LOWP;
      __s_00 = "1.0e1, 5.0e2, 2.0e2, 1.0";
      if (bVar7) {
        __s_00 = "0.8, 0.4, -0.2, 0.3";
      }
      __s_01 = "vec4(fract(used2 / 1.0e2).xyz - fract(used2 / 1.0e3).xyz, 0.0)";
      if (bVar7) {
        __s_01 = "vec4(fract(used2).xyz, 0.0)";
      }
      __s = "vec4(fract(unrelated2 / 1.0e2).xyz - fract(unrelated2 / 1.0e3).xyz, 0.0)";
      if (bVar7) {
        __s = "vec4(fract(unrelated2).xyz, 0.0)";
      }
      local_490 = (BasicInvarianceTest *)operator_new(0xf8);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      local_494 = precision;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_238,pcVar5,(allocator<char> *)&local_70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                     "subexpression_precision_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238)
      ;
      name = local_2d8._0_8_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_500,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&args);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_260,pcVar5,(allocator<char> *)&local_90);
      local_328._0_8_ = "UNRELATED_PREC";
      std::__cxx11::string::string((string *)(local_328 + 8),(string *)local_260);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_500,(FormatArgument *)local_328);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_288,__s_00,(allocator<char> *)&local_b0);
      local_350._0_8_ = "MULTIPLIER";
      std::__cxx11::string::string((string *)(local_350 + 8),(string *)local_288);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_500,(FormatArgument *)local_350);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2b0,__s_01,(allocator<char> *)&local_d0);
      local_378._0_8_ = "NORMALIZE_USED";
      std::__cxx11::string::string((string *)(local_378 + 8),(string *)local_2b0);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_500,(FormatArgument *)local_378);
      std::__cxx11::string::string<std::allocator<char>>(local_50,__s,(allocator<char> *)&local_f0);
      local_3a0._0_8_ = "NORMALIZE_UNRELATED";
      std::__cxx11::string::string((string *)(local_3a0 + 8),local_50);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_500,(FormatArgument *)local_3a0);
      (anonymous_namespace)::formatGLSL_abi_cxx11_
                ((string *)local_300,
                 (_anonymous_namespace_ *)
                 "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${UNRELATED_PREC} vec4 unrelated0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n\t${UNRELATED_PREC} vec4 unrelated1 = vec4(${MULTIPLIER}) * unrelated0.xywz + unrelated0;\n\t${UNRELATED_PREC} vec4 unrelated2 = refract(unrelated1, unrelated0, distance(unrelated0, unrelated1));\n\tv_unrelated = a_input + 0.02 * ${NORMALIZE_UNRELATED};\n\t${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n\t${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n\t${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n\tgl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n}\n"
                 ,(char *)local_500,(FormatArgumentList *)pcVar6);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_4c8,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&args);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1d0,pcVar5,(allocator<char> *)&local_110);
      local_3c8._0_8_ = "UNRELATED_PREC";
      std::__cxx11::string::string((string *)(local_3c8 + 8),local_1d0);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_4c8,(FormatArgument *)local_3c8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1f0,__s_00,(allocator<char> *)local_130);
      local_3f0._0_8_ = "MULTIPLIER";
      std::__cxx11::string::string((string *)(local_3f0 + 8),local_1f0);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_4c8,(FormatArgument *)local_3f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,__s_01,(allocator<char> *)local_150);
      local_418._0_8_ = "NORMALIZE_USED";
      std::__cxx11::string::string((string *)(local_418 + 8),(string *)&local_210);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_4c8,(FormatArgument *)local_418);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,__s,(allocator<char> *)local_170);
      local_440._0_8_ = "NORMALIZE_UNRELATED";
      std::__cxx11::string::string((string *)(local_440 + 8),(string *)&local_190);
      anon_unknown_1::FormatArgumentList::operator<<
                ((FormatArgumentList *)local_4c8,(FormatArgument *)local_440);
      (anonymous_namespace)::formatGLSL_abi_cxx11_
                (&local_1b0,
                 (_anonymous_namespace_ *)
                 "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n\t${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n\t${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n\tgl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n}\n"
                 ,(char *)local_4c8,(FormatArgumentList *)pcVar6);
      pBVar3 = local_490;
      pcVar6 = "Shader shares subexpression of different precision with an unrelated variable.";
      anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
                (local_490,pCVar1,(char *)name,
                 "Shader shares subexpression of different precision with an unrelated variable.",
                 (string *)local_300,&local_1b0);
      tcu::TestNode::addChild(this_00,(TestNode *)pBVar3);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)(local_440 + 8));
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)(local_418 + 8));
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)(local_3f0 + 8));
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string((string *)(local_3c8 + 8));
      std::__cxx11::string::~string(local_1d0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_4c8);
      std::__cxx11::string::~string((string *)local_300);
      std::__cxx11::string::~string((string *)(local_3a0 + 8));
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string((string *)(local_378 + 8));
      std::__cxx11::string::~string((string *)local_2b0);
      std::__cxx11::string::~string((string *)(local_350 + 8));
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::string::~string((string *)(local_328 + 8));
      std::__cxx11::string::~string((string *)local_260);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_500);
      std::__cxx11::string::~string((string *)local_2d8);
      std::__cxx11::string::~string((string *)local_238);
      precision = local_494 + PRECISION_MEDIUMP;
    }
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_500,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} highp vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tv_unrelated += value;\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_4c8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} highp vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    pcVar6 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"loop_0","Invariant value set using a loop",(string *)local_500,
               (string *)local_4c8);
    tcu::TestNode::addChild(this_00,(TestNode *)pBVar3);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string((string *)local_500);
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_500,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tif (i == ${LOOP_ITERS_PARTIAL})\n\t\t\tv_unrelated = value;\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_4c8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t}\n\tgl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    pcVar6 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"loop_1","Invariant value set using a loop",(string *)local_500,
               (string *)local_4c8);
    tcu::TestNode::addChild(this_00,(TestNode *)pBVar3);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string((string *)local_500);
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_500,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tif (i == ${LOOP_ITERS_PARTIAL})\n\t\t\tgl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n\t\telse\n\t\t\tv_unrelated = value + a_input;\n\t}\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_4c8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tv_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tif (i == ${LOOP_ITERS_PARTIAL})\n\t\t\tgl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n\t\telse\n\t\t\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\t}\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    pcVar6 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"loop_2","Invariant value set using a loop",(string *)local_500,
               (string *)local_4c8);
    tcu::TestNode::addChild(this_00,(TestNode *)pBVar3);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string((string *)local_500);
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_500,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tgl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n\t\tv_unrelated = gl_Position.xyzx * a_input;\n\t}\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_4c8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 value = a_input;\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue *= ${LOOP_MULTIPLIER};\n\t\tgl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n\t}\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    pcVar6 = "Invariant value set using a loop";
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"loop_3","Invariant value set using a loop",(string *)local_500,
               (string *)local_4c8);
    tcu::TestNode::addChild(this_00,(TestNode *)pBVar3);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string((string *)local_500);
    pBVar3 = (BasicInvarianceTest *)operator_new(0xf8);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_500,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 value1 = a_input;\n\t${IN_PREC} vec4 value2 = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue1 *= ${LOOP_MULTIPLIER};\n\t\tv_unrelated = v_unrelated*1.3 + a_input.xyzx * value1.xyxw;\n\t}\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue2 *= ${LOOP_MULTIPLIER};\n\t\tposition = position*1.3 + a_input.xyzx * value2.xyxw;\n\t}\n\tgl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    (anonymous_namespace)::formatGLSL_abi_cxx11_
              ((string *)local_4c8,
               (_anonymous_namespace_ *)
               "${VERSION}${IN} ${IN_PREC} vec4 a_input;\n${OUT} mediump vec4 v_unrelated;\ninvariant gl_Position;\nvoid main ()\n{\n\t${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n\t${IN_PREC} vec4 value2 = a_input;\n\tv_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n\tfor (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n\t{\n\t\tvalue2 *= ${LOOP_MULTIPLIER};\n\t\tposition = position*1.3 + a_input.xyzx * value2.xyxw;\n\t}\n\tgl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n}\n"
               ,(char *)&args,(FormatArgumentList *)pcVar6);
    anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
              (pBVar3,pCVar1,"loop_4","Invariant value set using a loop",(string *)local_500,
               (string *)local_4c8);
    tcu::TestNode::addChild(this_00,(TestNode *)pBVar3);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string((string *)local_500);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&args);
  }
  return 3;
}

Assistant:

void ShaderInvarianceTests::init (void)
{
	static const struct PrecisionCase
	{
		glu::Precision	prec;
		const char*		name;

		// set literals in the glsl to be in the representable range
		const char*		highValue;		// !< highValue < maxValue
		const char*		invHighValue;
		const char*		mediumValue;	// !< mediumValue^2 < maxValue
		const char*		lowValue;		// !< lowValue^4 < maxValue
		const char*		invlowValue;
		int				loopIterations;
		int				loopPartialIterations;
		int				loopNormalizationExponent;
		const char*		loopNormalizationConstantLiteral;
		const char*		loopMultiplier;
		const char*		sumLoopNormalizationConstantLiteral;
	} precisions[] =
	{
		{ glu::PRECISION_HIGHP,		"highp",	"1.0e20",	"1.0e-20",	"1.0e14",	"1.0e9",	"1.0e-9",	14,	11,	2,	"1.0e4",	"1.9",	"1.0e3"	},
		{ glu::PRECISION_MEDIUMP,	"mediump",	"1.0e4",	"1.0e-4",	"1.0e2",	"1.0e1",	"1.0e-1",	13,	11,	2,	"1.0e4",	"1.9",	"1.0e3"	},
		{ glu::PRECISION_LOWP,		"lowp",		"0.9",		"1.1",		"1.1",		"1.15",		"0.87",		6,	2,	0,	"2.0",		"1.1",	"1.0"	},
	};

	for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); ++precNdx)
	{
		const char* const			precisionName	= precisions[precNdx].name;
		const glu::Precision		precision		= precisions[precNdx].prec;
		tcu::TestCaseGroup* const	group			= new tcu::TestCaseGroup(m_testCtx, precisionName, "Invariance tests using the given precision.");

		const FormatArgumentList	args			= FormatArgumentList()
														<< FormatArgument("VERSION",				"")
														<< FormatArgument("IN",						"attribute")
														<< FormatArgument("OUT",					"varying")
														<< FormatArgument("IN_PREC",				precisionName)
														<< FormatArgument("HIGH_VALUE",				de::toString(precisions[precNdx].highValue))
														<< FormatArgument("HIGH_VALUE_INV",			de::toString(precisions[precNdx].invHighValue))
														<< FormatArgument("MEDIUM_VALUE",			de::toString(precisions[precNdx].mediumValue))
														<< FormatArgument("LOW_VALUE",				de::toString(precisions[precNdx].lowValue))
														<< FormatArgument("LOW_VALUE_INV",			de::toString(precisions[precNdx].invlowValue))
														<< FormatArgument("LOOP_ITERS",				de::toString(precisions[precNdx].loopIterations))
														<< FormatArgument("LOOP_ITERS_PARTIAL",		de::toString(precisions[precNdx].loopPartialIterations))
														<< FormatArgument("LOOP_NORM_FRACT_EXP",	de::toString(precisions[precNdx].loopNormalizationExponent))
														<< FormatArgument("LOOP_NORM_LITERAL",		precisions[precNdx].loopNormalizationConstantLiteral)
														<< FormatArgument("LOOP_MULTIPLIER",		precisions[precNdx].loopMultiplier)
														<< FormatArgument("SUM_LOOP_NORM_LITERAL",	precisions[precNdx].sumLoopNormalizationConstantLiteral);

		addChild(group);

		// subexpression cases
		{
			// First shader shares "${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy" with unrelated output variable. Reordering might result in accuracy loss
			// due to the high exponent. In the second shader, the high exponent may be removed during compilation.

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_0", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	v_unrelated = a_input.xzxz + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * (1.08 * a_input.zyzy * a_input.xzxz) * ${HIGH_VALUE_INV} * (a_input.z * a_input.zzxz - a_input.z * a_input.zzxz) + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) / ${HIGH_VALUE};\n"
							"	gl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	gl_Position = a_input + (${HIGH_VALUE}*a_input.x*a_input.xxxx + ${HIGH_VALUE}*a_input.y*a_input.yyyy) * ${HIGH_VALUE_INV};\n"
							"}\n", args)));

			// In the first shader, the unrelated variable "d" has mathematically the same expression as "e", but the different
			// order of calculation might cause different results.

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_1", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 a = ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy - ${HIGH_VALUE} * a_input.zzxx;\n"
							"	${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n"
							"	${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n"
							"	${IN_PREC} vec4 d = (${LOW_VALUE} * a_input.yzxx) * (${LOW_VALUE} * a_input.yzzw) * (1.1*${LOW_VALUE_INV} * a_input.yzxx) * (${LOW_VALUE_INV} * a_input.xzzy);\n"
							"	${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n"
							"	v_unrelated = a + b + c + d + e;\n"
							"	gl_Position = a_input + fract(c) + e;\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 b = ${HIGH_VALUE} * a_input.zzxx;\n"
							"	${IN_PREC} vec4 c = b - ${HIGH_VALUE} * a_input.zzxx + a_input.xzxy;\n"
							"	${IN_PREC} vec4 e = ((${LOW_VALUE} * a_input.yzxx) * (1.1*${LOW_VALUE_INV} * a_input.yzxx)) * ((${LOW_VALUE_INV} * a_input.xzzy) * (${LOW_VALUE} * a_input.yzzw));\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	gl_Position = a_input + fract(c) + e;\n"
							"}\n", args)));

			// Intermediate values used by an unrelated output variable

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_2", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n"
							"	${IN_PREC} vec4 b = (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) * (${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy)) / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n"
							"	${IN_PREC} vec4 c = a * a;\n"
							"	${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n"
							"	v_unrelated = a + b + c + d;\n"
							"	gl_Position = a_input + d;\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 a = ${MEDIUM_VALUE} * (a_input.xxxx + a_input.yyyy);\n"
							"	${IN_PREC} vec4 c = a * a;\n"
							"	${IN_PREC} vec4 d = c / ${MEDIUM_VALUE} / ${MEDIUM_VALUE};\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	gl_Position = a_input + d;\n"
							"}\n", args)));

			// Invariant value can be calculated using unrelated value

			group->addChild(new BasicInvarianceTest(m_context, "common_subexpression_3", "Shader shares a subexpression with an unrelated variable.",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} float x = a_input.x * 0.2;\n"
							"	${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n"
							"	${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n"
							"	${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n"
							"	${IN_PREC} vec4 f = x*a + x*b + x*c;\n"
							"	v_unrelated = f;\n"
							"	${IN_PREC} vec4 g = x * (a + b + c);\n"
							"	gl_Position = a_input + g;\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} float x = a_input.x * 0.2;\n"
							"	${IN_PREC} vec4 a = a_input.xxyx * 0.7;\n"
							"	${IN_PREC} vec4 b = a_input.yxyz * 0.7;\n"
							"	${IN_PREC} vec4 c = a_input.zxyx * 0.5;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	${IN_PREC} vec4 g = x * (a + b + c);\n"
							"	gl_Position = a_input + g;\n"
							"}\n", args)));
		}

		// shared subexpression of different precision
		{
			for (int precisionOther = glu::PRECISION_LOWP; precisionOther != glu::PRECISION_LAST; ++precisionOther)
			{
				const char* const		unrelatedPrec				= glu::getPrecisionName((glu::Precision)precisionOther);
				const glu::Precision	minPrecision				= (precisionOther < (int)precision) ? ((glu::Precision)precisionOther) : (precision);
				const char* const		multiplierStr				= (minPrecision == glu::PRECISION_LOWP) ? ("0.8, 0.4, -0.2, 0.3") : ("1.0e1, 5.0e2, 2.0e2, 1.0");
				const char* const		normalizationStrUsed		= (minPrecision == glu::PRECISION_LOWP) ? ("vec4(fract(used2).xyz, 0.0)") : ("vec4(fract(used2 / 1.0e2).xyz - fract(used2 / 1.0e3).xyz, 0.0)");
				const char* const		normalizationStrUnrelated	= (minPrecision == glu::PRECISION_LOWP) ? ("vec4(fract(unrelated2).xyz, 0.0)") : ("vec4(fract(unrelated2 / 1.0e2).xyz - fract(unrelated2 / 1.0e3).xyz, 0.0)");

				group->addChild(new BasicInvarianceTest(m_context, ("subexpression_precision_" + std::string(unrelatedPrec)).c_str(), "Shader shares subexpression of different precision with an unrelated variable.",
					formatGLSL(	"${VERSION}"
								"${IN} ${IN_PREC} vec4 a_input;\n"
								"${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\n"
								"invariant gl_Position;\n"
								"void main ()\n"
								"{\n"
								"	${UNRELATED_PREC} vec4 unrelated0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n"
								"	${UNRELATED_PREC} vec4 unrelated1 = vec4(${MULTIPLIER}) * unrelated0.xywz + unrelated0;\n"
								"	${UNRELATED_PREC} vec4 unrelated2 = refract(unrelated1, unrelated0, distance(unrelated0, unrelated1));\n"
								"	v_unrelated = a_input + 0.02 * ${NORMALIZE_UNRELATED};\n"
								"	${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n"
								"	${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n"
								"	${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n"
								"	gl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n"
								"}\n", FormatArgumentList(args)
											<< FormatArgument("UNRELATED_PREC",			unrelatedPrec)
											<< FormatArgument("MULTIPLIER",				multiplierStr)
											<< FormatArgument("NORMALIZE_USED",			normalizationStrUsed)
											<< FormatArgument("NORMALIZE_UNRELATED",	normalizationStrUnrelated)),
					formatGLSL(	"${VERSION}"
								"${IN} ${IN_PREC} vec4 a_input;\n"
								"${OUT} ${UNRELATED_PREC} vec4 v_unrelated;\n"
								"invariant gl_Position;\n"
								"void main ()\n"
								"{\n"
								"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
								"	${IN_PREC} vec4 used0 = a_input + vec4(0.1, 0.2, 0.3, 0.4);\n"
								"	${IN_PREC} vec4 used1 = vec4(${MULTIPLIER}) * used0.xywz + used0;\n"
								"	${IN_PREC} vec4 used2 = refract(used1, used0, distance(used0, used1));\n"
								"	gl_Position = a_input + 0.02 * ${NORMALIZE_USED};\n"
								"}\n", FormatArgumentList(args)
											<< FormatArgument("UNRELATED_PREC",			unrelatedPrec)
											<< FormatArgument("MULTIPLIER",				multiplierStr)
											<< FormatArgument("NORMALIZE_USED",			normalizationStrUsed)
											<< FormatArgument("NORMALIZE_UNRELATED",	normalizationStrUnrelated))));
			}
		}

		// loops
		{
			group->addChild(new BasicInvarianceTest(m_context, "loop_0", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} highp vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		v_unrelated += value;\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} highp vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_1", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		if (i == ${LOOP_ITERS_PARTIAL})\n"
							"			v_unrelated = value;\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"	}\n"
							"	gl_Position = vec4(value.xyz / ${LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_2", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		if (i == ${LOOP_ITERS_PARTIAL})\n"
							"			gl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"		else\n"
							"			v_unrelated = value + a_input;\n"
							"	}\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, -1.0, 1.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		if (i == ${LOOP_ITERS_PARTIAL})\n"
							"			gl_Position = a_input + 0.05 * vec4(fract(value.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"		else\n"
							"			v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	}\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_3", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		gl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"		v_unrelated = gl_Position.xyzx * a_input;\n"
							"	}\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 value = a_input;\n"
							"	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value *= ${LOOP_MULTIPLIER};\n"
							"		gl_Position += vec4(value.xyz / ${SUM_LOOP_NORM_LITERAL} + a_input.xyz * 0.1, 1.0);\n"
							"	}\n"
							"}\n", args)));

			group->addChild(new BasicInvarianceTest(m_context, "loop_4", "Invariant value set using a loop",
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	${IN_PREC} vec4 value1 = a_input;\n"
							"	${IN_PREC} vec4 value2 = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value1 *= ${LOOP_MULTIPLIER};\n"
							"		v_unrelated = v_unrelated*1.3 + a_input.xyzx * value1.xyxw;\n"
							"	}\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value2 *= ${LOOP_MULTIPLIER};\n"
							"		position = position*1.3 + a_input.xyzx * value2.xyxw;\n"
							"	}\n"
							"	gl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"}\n", args),
				formatGLSL(	"${VERSION}"
							"${IN} ${IN_PREC} vec4 a_input;\n"
							"${OUT} mediump vec4 v_unrelated;\n"
							"invariant gl_Position;\n"
							"void main ()\n"
							"{\n"
							"	${IN_PREC} vec4 position = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	${IN_PREC} vec4 value2 = a_input;\n"
							"	v_unrelated = vec4(0.0, 0.0, 0.0, 0.0);\n"
							"	for (mediump int i = 0; i < ${LOOP_ITERS}; ++i)\n"
							"	{\n"
							"		value2 *= ${LOOP_MULTIPLIER};\n"
							"		position = position*1.3 + a_input.xyzx * value2.xyxw;\n"
							"	}\n"
							"	gl_Position = a_input + 0.05 * vec4(fract(position.xyz / 1.0e${LOOP_NORM_FRACT_EXP}), 1.0);\n"
							"}\n", args)));
		}
	}
}